

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::MembraneHook::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,MembraneHook *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  uint *puVar1;
  bool bVar2;
  ClientHook *pCVar3;
  ClientHook *pCVar4;
  MembranePolicy *pMVar5;
  Builder builder_00;
  long *plVar6;
  capnp cVar7;
  undefined8 uVar8;
  PromiseBase node;
  MembraneHook *pMVar9;
  undefined8 *puVar10;
  long *plVar11;
  CapTableBuilder *pCVar12;
  int iVar13;
  RequestHook *pRVar14;
  uint64_t uVar15;
  char *condition;
  undefined6 in_register_0000008a;
  ulong uVar16;
  char *macroArgs;
  MembraneRequestHook *ptrCopy;
  Request<capnp::AnyPointer,_capnp::AnyPointer> *pRVar17;
  Disposer *pDVar18;
  Builder builder;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _p425;
  Maybe<capnp::Capability::Client> redirect;
  DebugComparison<capnp::_::CapTableBuilder_*,_capnp::(anonymous_namespace)::MembraneCapTableBuilder_*>
  *in_stack_fffffffffffffe48;
  undefined4 local_190;
  undefined4 uStack_18c;
  long *plStack_188;
  Request<capnp::AnyPointer,_capnp::AnyPointer> *local_180;
  uint64_t local_178;
  undefined1 local_170 [32];
  Disposer *local_150;
  PromiseBase local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  MembranePolicy *local_138;
  undefined1 local_128 [12];
  undefined4 uStack_11c;
  OwnPromiseNode local_118;
  undefined8 local_110;
  undefined1 local_108;
  char local_100 [8];
  undefined8 *local_f8;
  long *local_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  long *plStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  long *plStack_d0;
  PointerBuilder local_c8;
  Fault local_b0;
  char local_a8 [8];
  undefined4 local_a0;
  undefined4 uStack_9c;
  uint uStack_98;
  undefined4 uStack_94;
  char local_90 [8];
  undefined4 local_88;
  undefined4 uStack_84;
  uint uStack_80;
  undefined4 uStack_7c;
  char local_78 [8];
  undefined4 local_70;
  undefined4 uStack_6c;
  uint uStack_68;
  undefined4 uStack_64;
  char local_60 [8];
  uint64_t local_58;
  undefined8 uStack_50;
  PointerBuilder local_48;
  
  uVar16 = CONCAT62(in_register_0000008a,hints);
  pCVar3 = (this->resolved).ptr.ptr;
  if (pCVar3 != (ClientHook *)0x0) {
    pCVar4 = (this->resolved).ptr.ptr;
    local_60[0] = (sizeHint->ptr).isSet;
    if ((bool)local_60[0] == true) {
      local_58 = (sizeHint->ptr).field_1.value.wordCount;
      uStack_50 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar4->_vptr_ClientHook)
              (__return_storage_ptr__,pCVar4,interfaceId,(ulong)methodId,local_60,
               uVar16 & 0xffffffff);
    if (pCVar3 != (ClientHook *)0x0) {
      return __return_storage_ptr__;
    }
  }
  bVar2 = this->reverse;
  pMVar5 = (this->policy).ptr;
  local_180 = __return_storage_ptr__;
  local_178 = interfaceId;
  if (bVar2 == true) {
    (*((this->inner).ptr)->_vptr_ClientHook[4])(&local_190);
    uVar15 = local_178;
    local_d8 = local_190;
    uStack_d4 = uStack_18c;
    plStack_d0 = plStack_188;
    plStack_188 = (long *)0x0;
    (*pMVar5->_vptr_MembranePolicy[1])(local_100,pMVar5,local_178,(ulong)methodId);
  }
  else {
    (*((this->inner).ptr)->_vptr_ClientHook[4])(&local_190);
    uVar15 = local_178;
    local_e8 = local_190;
    uStack_e4 = uStack_18c;
    plStack_e0 = plStack_188;
    plStack_188 = (long *)0x0;
    (**pMVar5->_vptr_MembranePolicy)(local_100,pMVar5,local_178,(ulong)methodId);
  }
  plVar11 = plStack_d0;
  plVar6 = plStack_e0;
  if (bVar2 == false) {
    if (plStack_e0 != (long *)0x0) {
      plStack_e0 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_e4,local_e8))
                ((undefined8 *)CONCAT44(uStack_e4,local_e8),
                 (long)plVar6 + *(long *)(*plVar6 + -0x10));
    }
    plVar6 = plStack_188;
    uVar15 = local_178;
    pRVar17 = local_180;
    if (plStack_188 != (long *)0x0) {
      plStack_188 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_18c,local_190))
                ((undefined8 *)CONCAT44(uStack_18c,local_190),
                 (long)plVar6 + *(long *)(*plVar6 + -0x10));
      uVar15 = local_178;
      pRVar17 = local_180;
    }
  }
  else {
    if (plStack_d0 != (long *)0x0) {
      plStack_d0 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_d4,local_d8))
                ((undefined8 *)CONCAT44(uStack_d4,local_d8),
                 (long)plVar11 + *(long *)(*plVar11 + -0x10));
    }
    pRVar17 = local_180;
    plVar6 = plStack_188;
    if ((bVar2 != false) && (plStack_188 != (long *)0x0)) {
      plStack_188 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_18c,local_190))
                ((undefined8 *)CONCAT44(uStack_18c,local_190),
                 (long)plVar6 + *(long *)(*plVar6 + -0x10));
    }
  }
  if (local_100[0] == '\x01') {
    iVar13 = (*((this->policy).ptr)->_vptr_MembranePolicy[4])();
    if ((char)iVar13 != '\0') {
      whenMoreResolved((MembraneHook *)local_170);
      cVar7 = local_170[0];
      local_128[0] = (char)local_170[0];
      if (local_170[0] == (capnp)0x1) {
        stack0xfffffffffffffee0 = (MembraneHook *)local_170._8_8_;
        local_170._8_8_ = (MembraneHook *)0x0;
        puVar1 = &(this->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        local_c8.segment = (SegmentBuilder *)&this->super_Refcounted;
        local_c8.capTable = (CapTableBuilder *)this;
        kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
        attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                  ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_148,
                   (Own<capnp::ClientHook,_std::nullptr_t> *)(local_128 + 8));
        newLocalPromiseClient
                  ((capnp *)local_170,
                   (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&local_148);
        local_78[0] = (sizeHint->ptr).isSet;
        if ((bool)local_78[0] == true) {
          local_70 = *(undefined4 *)&(sizeHint->ptr).field_1;
          uStack_6c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
          uStack_68 = (sizeHint->ptr).field_1.value.capCount;
          uStack_64 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
        }
        (**((ClientHook *)local_170._8_8_)->_vptr_ClientHook)
                  (pRVar17,local_170._8_8_,local_178,(ulong)methodId,local_78,uVar16 & 0xffffffff);
        uVar8 = local_170._8_8_;
        if ((MembraneHook *)local_170._8_8_ != (MembraneHook *)0x0) {
          local_170._8_8_ = (MembraneHook *)0x0;
          (*(code *)**(undefined8 **)CONCAT44(local_170._4_4_,local_170._0_4_))
                    ((undefined8 *)CONCAT44(local_170._4_4_,local_170._0_4_),
                     (_func_int *)
                     ((long)&((ClientHook *)uVar8)->_vptr_ClientHook +
                     (long)((ClientHook *)uVar8)->_vptr_ClientHook[-2]));
        }
        node.node.ptr = local_148.node.ptr;
        if (local_148.node.ptr != (PromiseNode *)0x0) {
          local_148.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
        }
        pCVar12 = local_c8.capTable;
        if ((MembraneHook *)local_c8.capTable != (MembraneHook *)0x0) {
          local_c8.capTable = (CapTableBuilder *)0x0;
          (*(code *)(((local_c8.segment)->super_SegmentReader).arena)->_vptr_Arena)
                    (local_c8.segment,
                     (_func_int *)
                     ((long)&((ClientHook *)&pCVar12->super_CapTableReader)->_vptr_ClientHook +
                     (long)((ClientHook *)&pCVar12->super_CapTableReader)->_vptr_ClientHook[-2]));
        }
      }
      pMVar9 = stack0xfffffffffffffee0;
      if ((local_128[0] == '\x01') && (stack0xfffffffffffffee0 != (MembraneHook *)0x0)) {
        stack0xfffffffffffffee0 = (MembraneHook *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pMVar9);
      }
      if (cVar7 != (capnp)0x0) goto LAB_003238c0;
    }
    plVar6 = local_f0;
    puVar10 = local_f8;
    local_f0 = (long *)0x0;
    local_90[0] = (sizeHint->ptr).isSet;
    if ((bool)local_90[0] == true) {
      local_88 = *(undefined4 *)&(sizeHint->ptr).field_1;
      uStack_84 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_80 = (sizeHint->ptr).field_1.value.capCount;
      uStack_7c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    (**(code **)*plVar6)(pRVar17,plVar6,local_178,methodId,local_90,uVar16 & 0xffffffff);
    (**(code **)*puVar10)(puVar10,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  else {
    pCVar3 = (this->inner).ptr;
    local_a8[0] = (sizeHint->ptr).isSet;
    if ((bool)local_a8[0] == true) {
      local_a0 = *(undefined4 *)&(sizeHint->ptr).field_1;
      uStack_9c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_98 = (sizeHint->ptr).field_1.value.capCount;
      uStack_94 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    condition = local_a8;
    macroArgs = (char *)(uVar16 & 0xffffffff);
    (**pCVar3->_vptr_ClientHook)(local_170,pCVar3,uVar15);
    pDVar18 = local_150;
    uVar8 = local_170._24_8_;
    pMVar5 = (this->policy).ptr;
    bVar2 = this->reverse;
    local_138 = (MembranePolicy *)local_170._16_8_;
    local_148.node.ptr._4_4_ = local_170._4_4_;
    local_148.node.ptr._0_4_ = local_170._0_4_;
    uStack_140 = local_170._8_4_;
    uStack_13c = local_170._12_4_;
    local_150 = (Disposer *)0x0;
    if (((pDVar18[1]._vptr_Disposer == (_func_int **)&capnp::(anonymous_namespace)::DUMMY) &&
        ((MembranePolicy *)pDVar18[5]._vptr_Disposer == pMVar5)) &&
       ((bool)*(char *)&pDVar18[6]._vptr_Disposer != bVar2)) {
      local_c8.pointer = (WirePointer *)local_170._16_8_;
      local_c8.segment = (SegmentBuilder *)CONCAT44(local_170._4_4_,local_170._0_4_);
      local_c8.capTable = (CapTableBuilder *)local_170._8_8_;
      local_128._0_8_ = capnp::_::PointerBuilder::getCapTable(&local_c8);
      unique0x00004780 = (MembraneHook *)(pDVar18 + 7);
      local_118.ptr = (PromiseNode *)0x4fd0ae;
      local_110 = 5;
      local_108 = (MembraneHook *)local_128._0_8_ == unique0x00004780;
      if (!(bool)local_108) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::CapTableBuilder*,capnp::(anonymous_namespace)::MembraneCapTableBuilder*>&>
                  (&local_b0,local_128,0x4fd0ae,(Type)unique0x00004780,condition,macroArgs,
                   in_stack_fffffffffffffe48);
        kj::_::Debug::Fault::fatal(&local_b0);
      }
      capnp::_::PointerBuilder::imbue
                (&local_48,&local_c8,(CapTableBuilder *)pDVar18[8]._vptr_Disposer);
      uStack_140 = local_48.capTable._0_4_;
      uStack_13c = local_48.capTable._4_4_;
      local_148.node.ptr._4_4_ = local_48.segment._4_4_;
      local_148.node.ptr._0_4_ = local_48.segment._0_4_;
      local_138 = (MembranePolicy *)local_48.pointer;
      (local_180->super_Builder).builder.pointer = local_48.pointer;
      *(undefined4 *)&(local_180->super_Builder).builder.segment = local_48.segment._0_4_;
      *(undefined4 *)((long)&(local_180->super_Builder).builder.segment + 4) =
           local_48.segment._4_4_;
      *(undefined4 *)&(local_180->super_Builder).builder.capTable = local_48.capTable._0_4_;
      *(undefined4 *)((long)&(local_180->super_Builder).builder.capTable + 4) =
           local_48.capTable._4_4_;
      (local_180->hook).disposer = (Disposer *)pDVar18[2]._vptr_Disposer;
      (local_180->hook).ptr = (RequestHook *)pDVar18[3]._vptr_Disposer;
      pDVar18[3]._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (*pMVar5->_vptr_MembranePolicy[2])(local_128);
      pRVar14 = (RequestHook *)operator_new(0x58);
      pMVar9 = stack0xfffffffffffffee0;
      pRVar14->brand = &capnp::(anonymous_namespace)::MEMBRANE_BRAND;
      pRVar14->_vptr_RequestHook = (_func_int **)&PTR_send_006f92e0;
      pRVar14[1]._vptr_RequestHook = (_func_int **)uVar8;
      pRVar14[1].brand = pDVar18;
      pRVar14[2]._vptr_RequestHook = (_func_int **)local_128._0_8_;
      pRVar14[2].brand = stack0xfffffffffffffee0;
      stack0xfffffffffffffee0 = (MembraneHook *)0x0;
      *(bool *)&pRVar14[3]._vptr_RequestHook = bVar2;
      pRVar14[3].brand = &PTR_extractCap_006f9320;
      pRVar14[4]._vptr_RequestHook = (_func_int **)0x0;
      pRVar14[4].brand = pMVar9;
      *(bool *)&pRVar14[5]._vptr_RequestHook = bVar2;
      builder_00.builder.capTable._4_4_ = uStack_13c;
      builder_00.builder.capTable._0_4_ = uStack_140;
      builder_00.builder.segment = (SegmentBuilder *)local_148.node.ptr;
      builder_00.builder.pointer = (WirePointer *)local_138;
      anon_unknown_0::MembraneCapTableBuilder::imbue
                ((Builder *)local_128,(MembraneCapTableBuilder *)&pRVar14[3].brand,builder_00);
      local_138 = (MembranePolicy *)local_118.ptr;
      local_148.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_128._0_8_;
      uStack_140 = local_128._8_4_;
      uStack_13c = uStack_11c;
      (local_180->super_Builder).builder.pointer = (WirePointer *)local_118.ptr;
      *(undefined4 *)&(local_180->super_Builder).builder.segment = local_128._0_4_;
      *(undefined4 *)((long)&(local_180->super_Builder).builder.segment + 4) = local_128._4_4_;
      *(undefined4 *)&(local_180->super_Builder).builder.capTable = local_128._8_4_;
      *(undefined4 *)((long)&(local_180->super_Builder).builder.capTable + 4) = uStack_11c;
      (local_180->hook).disposer =
           (Disposer *)
           &kj::_::HeapDisposer<capnp::(anonymous_namespace)::MembraneRequestHook>::instance;
      (local_180->hook).ptr = pRVar14;
      pDVar18 = (Disposer *)0x0;
    }
    if (pDVar18 != (Disposer *)0x0) {
      (**(code **)*(_func_int **)uVar8)
                (uVar8,pDVar18->_vptr_Disposer[-2] + (long)&pDVar18->_vptr_Disposer);
    }
    pDVar18 = local_150;
    pRVar17 = local_180;
    if (local_150 != (Disposer *)0x0) {
      local_150 = (Disposer *)0x0;
      (**(code **)*(_func_int **)local_170._24_8_)
                (local_170._24_8_,pDVar18->_vptr_Disposer[-2] + (long)&pDVar18->_vptr_Disposer);
      pRVar17 = local_180;
    }
  }
LAB_003238c0:
  plVar6 = local_f0;
  if ((local_100[0] == '\x01') && (local_f0 != (long *)0x0)) {
    local_f0 = (long *)0x0;
    (**(code **)*local_f8)(local_f8,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  return pRVar17;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    KJ_IF_SOME(r, resolved) {
      return r->newCall(interfaceId, methodId, sizeHint, hints);
    }

    auto redirect = reverse
        ? policy->outboundCall(interfaceId, methodId, Capability::Client(inner->addRef()))
        : policy->inboundCall(interfaceId, methodId, Capability::Client(inner->addRef()));
    KJ_IF_SOME(r, redirect) {
      if (policy->shouldResolveBeforeRedirecting()) {
        // The policy says that *if* this capability points into the membrane, then we want to
        // redirect the call. However, if this capability is a promise, then it could resolve to
        // something outside the membrane later. We have to wait before we actually redirect,
        // otherwise behavior will differ depending on whether the promise is resolved.
        KJ_IF_SOME(p, whenMoreResolved()) {
          return newLocalPromiseClient(p.attach(addRef()))
              ->newCall(interfaceId, methodId, sizeHint, hints);
        }
      }

      return ClientHook::from(kj::mv(r))->newCall(interfaceId, methodId, sizeHint, hints);
    } else {
      // For pass-through calls, we don't worry about promises, because if the capability resolves
      // to something outside the membrane, then the call will pass back out of the membrane too.
      return MembraneRequestHook::wrap(
          inner->newCall(interfaceId, methodId, sizeHint, hints), *policy, reverse);
    }